

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver_test.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::
NameResolverTest_MultipleFilesMessageEdition2023_Test::
~NameResolverTest_MultipleFilesMessageEdition2023_Test
          (NameResolverTest_MultipleFilesMessageEdition2023_Test *this)

{
  NameResolverTest_MultipleFilesMessageEdition2023_Test *this_local;
  
  ~NameResolverTest_MultipleFilesMessageEdition2023_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(NameResolverTest, MultipleFilesMessageEdition2023) {
  BuildFileAndPopulatePool("foo.proto",
                           R"schema(
      edition = "2023";

      option java_multiple_files = true;

      package proto2_unittest;

      message FooMessage {}
                )schema");

  auto message_descriptor =
      pool_.FindMessageTypeByName("proto2_unittest.FooMessage");
  ClassNameResolver resolver;

  EXPECT_EQ(resolver.GetClassName(message_descriptor, /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.FooMessage");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(message_descriptor),
            PACKAGE_PREFIX "proto2_unittest.FooMessage");
}